

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction.cpp
# Opt level: O0

void __thiscall cfd::core::Transaction::RemoveTxIn(Transaction *this,uint32_t index)

{
  __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
  local_20;
  const_iterator ite;
  uint32_t index_local;
  Transaction *this_local;
  
  ite._M_current._4_4_ = index;
  AbstractTransaction::RemoveTxIn(&this->super_AbstractTransaction,index);
  local_20._M_current =
       (TxIn *)::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::cbegin(&this->vin_)
  ;
  if (ite._M_current._4_4_ != 0) {
    __gnu_cxx::
    __normal_iterator<const_cfd::core::TxIn_*,_std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>_>
    ::operator+=(&local_20,(ulong)ite._M_current._4_4_);
  }
  ::std::vector<cfd::core::TxIn,_std::allocator<cfd::core::TxIn>_>::erase
            (&this->vin_,(const_iterator)local_20._M_current);
  (*(this->super_AbstractTransaction)._vptr_AbstractTransaction[10])(this,4);
  return;
}

Assistant:

void Transaction::RemoveTxIn(uint32_t index) {
  AbstractTransaction::RemoveTxIn(index);

  std::vector<TxIn>::const_iterator ite = vin_.cbegin();
  if (index != 0) {
    ite += index;
  }
  vin_.erase(ite);
  CallbackStateChange(kStateChangeRemoveTxIn);
}